

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_init_destroy_context_Test::TestBody(cubeb_init_destroy_context_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *backend_id;
  cubeb *ctx;
  int r;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  AssertHelper in_stack_ffffffffffffff68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  AssertHelper local_78;
  Message local_70;
  undefined8 local_68;
  void **in_stack_ffffffffffffffa0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar3;
  AssertHelper in_stack_ffffffffffffffb8;
  Message local_40;
  undefined4 local_34;
  AssertionResult local_30;
  char *local_20;
  int local_c;
  
  local_c = common_init((cubeb **)in_stack_ffffffffffffff70.ptr_,
                        (char *)in_stack_ffffffffffffff68.data_);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70.ptr_,
             (int *)in_stack_ffffffffffffff68.data_,(anon_enum_32 *)in_stack_ffffffffffffff60.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70.ptr_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x108bad);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffb8,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    testing::Message::~Message((Message *)0x108bee);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x108c0a);
  if (uVar3 == 0) {
    local_68 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)in_stack_ffffffffffffffb8.data_,(char *)(ulong)in_stack_ffffffffffffffb0,
               (cubeb **)in_stack_ffffffffffffffa8.ptr_,in_stack_ffffffffffffffa0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffa0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff70.ptr_);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x108c6d);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x55,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message((Message *)0x108cae);
    }
    uVar3 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x108cca);
    if (uVar3 == 0) {
      local_20 = cubeb_get_backend_id
                           ((cubeb *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_ffffffffffffff60.ptr_,(bool)in_stack_ffffffffffffff5f);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff78);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff70.ptr_);
        testing::internal::GetBoolAssertionFailureMessage
                  ((AssertionResult *)&stack0xffffffffffffff58,&stack0xffffffffffffff78,"backend_id"
                   ,"false");
        pcVar2 = testing::internal::String::c_str((String *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,0x58,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff68,(Message *)&stack0xffffffffffffff70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff68);
        testing::internal::String::~String((String *)in_stack_ffffffffffffff60.ptr_);
        testing::Message::~Message((Message *)0x108d9c);
      }
      uVar3 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x108db8);
      if (uVar3 == 0) {
        fprintf(_stderr,"Backend: %s\n",local_20);
        cubeb_destroy((cubeb *)0x108df1);
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const* backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}